

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void __thiscall
duckdb::BinaryAggregateHeap<float,_long,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<float,_long,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          float *key,long *value)

{
  bool bVar1;
  float *in_RCX;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> *in_RDX;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> *in_RSI;
  float *in_RDI;
  _func_bool_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_ptr_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_ptr
  *unaff_retaddr;
  
  if (*(ulong *)(in_RDI + 4) < *(ulong *)in_RDI) {
    HeapEntry<float>::Assign
              ((HeapEntry<float> *)(*(long *)(in_RDI + 2) + *(long *)(in_RDI + 4) * 0x10),
               (ArenaAllocator *)in_RSI,(float *)in_RDX);
    HeapEntry<long>::Assign
              ((HeapEntry<long> *)(*(long *)(in_RDI + 2) + *(long *)(in_RDI + 4) * 0x10 + 8),
               (ArenaAllocator *)in_RSI,(long *)in_RCX);
    *(long *)(in_RDI + 4) = *(long *)(in_RDI + 4) + 1;
    std::
    push_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>*,bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&)>
              ((pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> *)key,
               (pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> *)value,unaff_retaddr);
  }
  else {
    bVar1 = LessThan::Operation<float>(in_RCX,in_RDI);
    if (bVar1) {
      std::
      pop_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>*,bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&)>
                (in_RSI,in_RDX,
                 (_func_bool_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_ptr_pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_>_ptr
                  *)in_RCX);
      HeapEntry<float>::Assign
                ((HeapEntry<float> *)(*(long *)(in_RDI + 2) + (*(long *)(in_RDI + 4) + -1) * 0x10),
                 (ArenaAllocator *)in_RSI,(float *)in_RDX);
      HeapEntry<long>::Assign
                ((HeapEntry<long> *)
                 (*(long *)(in_RDI + 2) + (*(long *)(in_RDI + 4) + -1) * 0x10 + 8),
                 (ArenaAllocator *)in_RSI,(long *)in_RCX);
      std::
      push_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>*,bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<long>>const&)>
                ((pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> *)key,
                 (pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<long>_> *)value,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}